

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# norm2allmodes.h
# Opt level: O3

int32_t __thiscall
icu_63::Normalizer2WithImpl::spanQuickCheckYes
          (Normalizer2WithImpl *this,UnicodeString *s,UErrorCode *errorCode)

{
  ushort uVar1;
  int32_t iVar2;
  int iVar3;
  undefined4 extraout_var;
  char16_t *pcVar4;
  
  iVar2 = 0;
  if (U_ZERO_ERROR < *errorCode) {
    return iVar2;
  }
  uVar1 = (s->fUnion).fStackFields.fLengthAndFlags;
  if ((uVar1 & 0x11) == 0) {
    if ((uVar1 & 2) == 0) {
      pcVar4 = (s->fUnion).fFields.fArray;
      if (pcVar4 == (char16_t *)0x0) goto LAB_002a4063;
    }
    else {
      pcVar4 = (char16_t *)((long)&s->fUnion + 2);
    }
    if ((short)uVar1 < 0) {
      iVar3 = (s->fUnion).fFields.fLength;
    }
    else {
      iVar3 = (int)(short)uVar1 >> 5;
    }
    iVar3 = (*(this->super_Normalizer2).super_UObject._vptr_UObject[0x14])
                      (this,pcVar4,pcVar4 + iVar3);
    iVar2 = (int32_t)((ulong)(CONCAT44(extraout_var,iVar3) - (long)pcVar4) >> 1);
  }
  else {
LAB_002a4063:
    *errorCode = U_ILLEGAL_ARGUMENT_ERROR;
  }
  return iVar2;
}

Assistant:

virtual int32_t
    spanQuickCheckYes(const UnicodeString &s, UErrorCode &errorCode) const {
        if(U_FAILURE(errorCode)) {
            return 0;
        }
        const UChar *sArray=s.getBuffer();
        if(sArray==NULL) {
            errorCode=U_ILLEGAL_ARGUMENT_ERROR;
            return 0;
        }
        return (int32_t)(spanQuickCheckYes(sArray, sArray+s.length(), errorCode)-sArray);
    }